

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O0

int FmsTagSet(FmsTag tag,FmsIntType stored_tag_type,FmsIntType input_tag_type,void *ent_tags,
             FmsInt num_ents)

{
  void *pvVar1;
  long in_RCX;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  long in_R8;
  FmsComponent comp;
  FmsInt in_stack_00000210;
  void *in_stack_00000218;
  FmsIntType in_stack_00000224;
  void *in_stack_00000228;
  FmsIntType in_stack_00000230;
  int local_4;
  
  if (in_RDI == 0) {
    local_4 = 1;
  }
  else if (in_ESI < 8) {
    if ((*(int *)(in_RDI + 0x18) == 8) || (*(uint *)(in_RDI + 0x18) == in_ESI)) {
      if (in_EDX < 8) {
        if (*(long *)(in_RDI + 8) == 0) {
          local_4 = 5;
        }
        else if (*(long *)(*(long *)(in_RDI + 8) + 0x18) == in_R8) {
          if ((in_R8 == 0) || (in_RCX != 0)) {
            free(*(void **)(in_RDI + 0x20));
            *(undefined8 *)(in_RDI + 0x20) = 0;
            if (in_R8 != 0) {
              pvVar1 = malloc(in_R8 * FmsIntTypeSize[in_ESI]);
              *(void **)(in_RDI + 0x20) = pvVar1;
              if (*(long *)(in_RDI + 0x20) == 0) {
                return 8;
              }
              FmsIntConvertCopy(in_stack_00000230,in_stack_00000228,in_stack_00000224,
                                in_stack_00000218,in_stack_00000210);
            }
            *(uint *)(in_RDI + 0x18) = in_ESI;
            local_4 = 0;
          }
          else {
            local_4 = 7;
          }
        }
        else {
          local_4 = 6;
        }
      }
      else {
        local_4 = 4;
      }
    }
    else {
      local_4 = 3;
    }
  }
  else {
    local_4 = 2;
  }
  return local_4;
}

Assistant:

int FmsTagSet(FmsTag tag, FmsIntType stored_tag_type, FmsIntType input_tag_type,
              const void *ent_tags, FmsInt num_ents) {
  if (!tag) { E_RETURN(1); }
  if (stored_tag_type >= FMS_NUM_INT_TYPES) { E_RETURN(2); }
  if (tag->tag_type != FMS_NUM_INT_TYPES && tag->tag_type != stored_tag_type) {
    E_RETURN(3);
  }
  if (input_tag_type >= FMS_NUM_INT_TYPES) { E_RETURN(4); }
  FmsComponent comp = tag->comp;
  if (!comp) { E_RETURN(5); }
  if (comp->num_main_entities != num_ents) { E_RETURN(6); }
  if (num_ents != 0 && ent_tags == NULL) { E_RETURN(7); }
  free(tag->tags);
  tag->tags = NULL;
  if (num_ents != 0) {
    tag->tags = malloc(num_ents*FmsIntTypeSize[stored_tag_type]);
    if (tag->tags == NULL) { E_RETURN(8); }
    FmsIntConvertCopy(input_tag_type, ent_tags, stored_tag_type, tag->tags,
                      num_ents);
  }
  tag->tag_type = stored_tag_type;
  return 0;
}